

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

void __thiscall CCharmapToLocal::load_table(CCharmapToLocal *this,osfildef *fp)

{
  ushort uVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  uchar *puVar5;
  wchar_t *pwVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  uchar buf [256];
  ushort local_138;
  byte bStack_136;
  undefined1 uStack_135;
  undefined2 uStack_134;
  
  lVar3 = ftell((FILE *)fp);
  sVar4 = fread(&local_138,4,1,(FILE *)fp);
  if (sVar4 == 1) {
    fseek((FILE *)fp,lVar3 + (ulong)CONCAT13(uStack_135,CONCAT12(bStack_136,local_138)),0);
    sVar4 = fread(&local_138,6,1,(FILE *)fp);
    uVar1 = local_138;
    if (sVar4 == 1) {
      uVar7 = (uint)local_138;
      puVar5 = (uchar *)malloc((ulong)CONCAT22(uStack_134,CONCAT11(uStack_135,bStack_136)));
      this->xlat_array_ = puVar5;
      if (puVar5 != (uchar *)0x0) {
        if (uVar1 != 0) {
          uVar9 = 0;
          do {
            sVar4 = fread(&local_138,3,1,(FILE *)fp);
            bVar2 = bStack_136;
            if (sVar4 == 1) {
              uVar8 = (ulong)bStack_136;
              set_mapping(this,(uint)local_138,(uint)uVar9);
              uVar10 = (uint)uVar9 + 1;
              this->xlat_array_[uVar9] = bVar2;
              sVar4 = fread(this->xlat_array_ + uVar10,uVar8,1,(FILE *)fp);
              uVar9 = (ulong)uVar10;
              if (sVar4 != 1) goto LAB_001f243a;
              uVar9 = (ulong)(uVar10 + bVar2);
              bVar11 = true;
            }
            else {
LAB_001f243a:
              bVar11 = false;
            }
            if (!bVar11) {
              return;
            }
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        sVar4 = fread(&local_138,6,1,(FILE *)fp);
        if ((sVar4 == 1) && (CONCAT13(uStack_135,CONCAT12(bStack_136,local_138)) != 0x464f4524)) {
          uVar9 = (ulong)local_138;
          pwVar6 = (wchar_t *)
                   malloc((CONCAT22(uStack_134,CONCAT11(uStack_135,bStack_136)) + uVar9) * 4 + 4);
          this->exp_array_ = pwVar6;
          if (pwVar6 != (wchar_t *)0x0 && uVar9 != 0) {
            uVar7 = 1;
            do {
              sVar4 = fread(&local_138,3,1,(FILE *)fp);
              bVar2 = bStack_136;
              if (sVar4 == 1) {
                uVar8 = (ulong)bStack_136;
                set_exp_mapping(this,(uint)local_138,uVar7);
                uVar10 = uVar7 + 1;
                this->exp_array_[uVar7] = (uint)bVar2;
                if (uVar8 == 0) {
                  bVar11 = true;
                  uVar7 = uVar10;
                }
                else {
                  do {
                    sVar4 = fread(&local_138,2,1,(FILE *)fp);
                    bVar11 = sVar4 == 1;
                    uVar7 = uVar10;
                    if (!bVar11) break;
                    this->exp_array_[uVar10] = (uint)local_138;
                    uVar7 = uVar10 + 1;
                    uVar8 = uVar8 - 1;
                    uVar10 = uVar7;
                  } while (uVar8 != 0);
                }
              }
              else {
                bVar11 = false;
              }
            } while ((bVar11) && (uVar10 = (int)uVar9 - 1, uVar9 = (ulong)uVar10, uVar10 != 0));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CCharmapToLocal::load_table(osfildef *fp)
{
    ulong startpos;
    ulong ofs;
    uchar buf[256];
    uint cnt;
    ulong xbytes;
    ulong xchars;
    uint next_ofs;
    
    /* note the initial seek position */
    startpos = osfpos(fp);

    /* read the first entry, which gives the offset of the to-local table */
    if (osfrb(fp, buf, 4))
        return;
    ofs = t3rp4u(buf);

    /* seek to the to-local table */
    osfseek(fp, startpos + ofs, OSFSK_SET);

    /* read the number of entries and number of bytes needed */
    if (osfrb(fp, buf, 6))
        return;
    cnt = osrp2(buf);
    xbytes = t3rp4u(buf + 2);

    /* 
     *   Allocate space for the translation table.  Note that we cannot
     *   handle translation tables bigger than the maximum allowed in a
     *   single allocation unit on the operating system. 
     */
    if (xbytes > OSMALMAX)
        return;
    xlat_array_ = (unsigned char *)t3malloc(xbytes);
    if (xlat_array_ == 0)
        return;

    /*
     *   Read each mapping 
     */
    for (next_ofs = 0 ; cnt > 0 ; --cnt)
    {
        wchar_t codept;
        uint xlen;
        
        /* read the code point and translation length */
        if (osfrb(fp, buf, 3))
            return;

        /* decode the code point and translation length */
        codept = osrp2(buf);
        xlen = (unsigned int)buf[2];

        /* assign the mapping */
        set_mapping(codept, next_ofs);

        /* store the translation length */
        xlat_array_[next_ofs++] = buf[2];

        /* read the translation bytes */
        if (osfrb(fp, xlat_array_ + next_ofs, xlen))
            return;

        /* skip past the translation bytes we've read */
        next_ofs += xlen;
    }

    /*
     *   Next, read the expansions, if present.
     *   
     *   If we find the $EOF marker, it means it's an old-format file without
     *   the separate expansion definitions.  Otherwise, we'll have the
     *   expansion entry count and the aggregate number of unicode characters
     *   in all of the expansions.  
     */
    if (osfrb(fp, buf, 6) || memcmp(buf, "$EOF", 4) == 0)
        return;

    /* decode the expansion entry count and aggregate length */
    cnt = osrp2(buf);
    xchars = t3rp4u(buf + 2);

    /* 
     *   add one entry so that we can leave index zero unused, to indicate
     *   unmapped characters 
     */
    ++xchars;

    /* add one array slot per entry, for the length prefix slots */
    xchars += cnt;

    /* allocate space for the expansions */
    exp_array_ = (wchar_t *)t3malloc(xchars * sizeof(wchar_t));
    if (exp_array_ == 0)
        return;

    /* 
     *   read the mappings; start loading them at index 1, since we want to
     *   leave index 0 unused so that it can indicate unused mappings 
     */
    for (next_ofs = 1 ; cnt > 0 ; --cnt)
    {
        wchar_t codept;
        uint xlen;
        size_t i;

        /* read this entry's unicode value and expansion character length */
        if (osfrb(fp, buf, 3))
            return;

        /* decode the code point and expansion length */
        codept = osrp2(buf);
        xlen = (uint)buf[2];

        /* assign the expansion mapping */
        set_exp_mapping(codept, next_ofs);

        /* set the length prefix */
        exp_array_[next_ofs++] = (wchar_t)xlen;

        /* read and store the expansion characters */
        for (i = 0 ; i < xlen ; ++i)
        {
            /* read this translation */
            if (osfrb(fp, buf, 2))
                return;

            /* decode and store this translation */
            exp_array_[next_ofs++] = osrp2(buf);
        }
    }
}